

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_sx_sy_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  char cVar4;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar16 [16];
  short sVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  auVar14 = _DAT_00517cc0;
  auVar13 = _DAT_005177f0;
  auVar12 = _DAT_004d2510;
  do {
    puVar1 = mask + mask_stride;
    auVar27[0] = *puVar1 + *mask;
    auVar27[1] = puVar1[1] + mask[1];
    auVar27[2] = puVar1[2] + mask[2];
    auVar27[3] = puVar1[3] + mask[3];
    auVar27[4] = puVar1[4] + mask[4];
    auVar27[5] = puVar1[5] + mask[5];
    auVar27[6] = puVar1[6] + mask[6];
    auVar27[7] = puVar1[7] + mask[7];
    auVar27[8] = puVar1[8] + mask[8];
    auVar27[9] = puVar1[9] + mask[9];
    auVar27[10] = puVar1[10] + mask[10];
    auVar27[0xb] = puVar1[0xb] + mask[0xb];
    auVar27[0xc] = puVar1[0xc] + mask[0xc];
    auVar27[0xd] = puVar1[0xd] + mask[0xd];
    auVar27[0xe] = puVar1[0xe] + mask[0xe];
    auVar27[0xf] = puVar1[0xf] + mask[0xf];
    auVar24 = pshufb(auVar27,auVar14);
    auVar16._0_8_ = auVar24._8_8_;
    auVar16._8_4_ = auVar24._8_4_;
    auVar16._12_4_ = auVar24._12_4_;
    auVar27 = auVar24 & auVar16;
    auVar24 = auVar24 ^ auVar16;
    auVar25._0_2_ = auVar24._0_2_ >> 1;
    auVar25._2_2_ = auVar24._2_2_ >> 1;
    auVar25._4_2_ = auVar24._4_2_ >> 1;
    auVar25._6_2_ = auVar24._6_2_ >> 1;
    auVar25._8_2_ = auVar24._8_2_ >> 1;
    auVar25._10_2_ = auVar24._10_2_ >> 1;
    auVar25._12_2_ = auVar24._12_2_ >> 1;
    auVar25._14_2_ = auVar24._14_2_ >> 1;
    auVar25 = auVar25 & auVar12;
    auVar26[0] = auVar25[0] + auVar27[0];
    auVar26[1] = auVar25[1] + auVar27[1];
    auVar26[2] = auVar25[2] + auVar27[2];
    auVar26[3] = auVar25[3] + auVar27[3];
    auVar26[4] = auVar25[4] + auVar27[4];
    auVar26[5] = auVar25[5] + auVar27[5];
    auVar26[6] = auVar25[6] + auVar27[6];
    auVar26[7] = auVar25[7] + auVar27[7];
    auVar26[8] = auVar25[8] + auVar27[8];
    auVar26[9] = auVar25[9] + auVar27[9];
    auVar26[10] = auVar25[10] + auVar27[10];
    auVar26[0xb] = auVar25[0xb] + auVar27[0xb];
    auVar26[0xc] = auVar25[0xc] + auVar27[0xc];
    auVar26[0xd] = auVar25[0xd] + auVar27[0xd];
    auVar26[0xe] = auVar25[0xe] + auVar27[0xe];
    auVar26[0xf] = auVar25[0xf] + auVar27[0xf];
    auVar16 = pmovzxbw(auVar16,auVar26);
    sVar15 = pavgw(auVar16._0_2_,0);
    sVar17 = pavgw(auVar16._2_2_,0);
    sVar18 = pavgw(auVar16._4_2_,0);
    sVar19 = pavgw(auVar16._6_2_,0);
    sVar20 = pavgw(auVar16._8_2_,0);
    sVar21 = pavgw(auVar16._10_2_,0);
    sVar22 = pavgw(auVar16._12_2_,0);
    sVar23 = pavgw(auVar16._14_2_,0);
    cVar4 = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    cVar5 = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    cVar6 = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    cVar7 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    cVar8 = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    cVar10 = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    cVar11 = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    uVar2 = *(ulong *)src0;
    uVar3 = *(undefined8 *)src1;
    auVar35._8_6_ = 0;
    auVar35._0_8_ = uVar2;
    auVar35[0xe] = (char)(uVar2 >> 0x38);
    auVar35[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar34._14_2_ = auVar35._14_2_;
    auVar34._8_5_ = 0;
    auVar34._0_8_ = uVar2;
    auVar34[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar33._13_3_ = auVar34._13_3_;
    auVar33._8_4_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33[0xc] = (char)(uVar2 >> 0x30);
    auVar32._12_4_ = auVar33._12_4_;
    auVar32._8_3_ = 0;
    auVar32._0_8_ = uVar2;
    auVar32[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar31._11_5_ = auVar32._11_5_;
    auVar31._8_2_ = 0;
    auVar31._0_8_ = uVar2;
    auVar31[10] = (char)(uVar2 >> 0x28);
    auVar30._10_6_ = auVar31._10_6_;
    auVar30[8] = 0;
    auVar30._0_8_ = uVar2;
    auVar30[9] = (char)((ulong)uVar3 >> 0x20);
    auVar29._9_7_ = auVar30._9_7_;
    auVar29[8] = (char)(uVar2 >> 0x20);
    auVar29._0_8_ = uVar2;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28[7] = (char)((ulong)uVar3 >> 0x18);
    auVar28[6] = (char)(uVar2 >> 0x18);
    auVar28[5] = (char)((ulong)uVar3 >> 0x10);
    auVar28[4] = (char)(uVar2 >> 0x10);
    auVar28[3] = (char)((ulong)uVar3 >> 8);
    auVar28[2] = (char)(uVar2 >> 8);
    auVar28[0] = (undefined1)uVar2;
    auVar28[1] = (char)uVar3;
    auVar24._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar11,cVar11),
                                                                '@' - cVar10),cVar10),'@' - cVar9),
                                     cVar9),'@' - cVar8),CONCAT11(cVar8,cVar11)) >> 8);
    auVar24[7] = '@' - cVar7;
    auVar24[6] = cVar7;
    auVar24[5] = '@' - cVar6;
    auVar24[4] = cVar6;
    auVar24[3] = '@' - cVar5;
    auVar24[2] = cVar5;
    auVar24[1] = '@' - cVar4;
    auVar24[0] = cVar4;
    auVar16 = pmaddubsw(auVar28,auVar24);
    auVar16 = pmulhrsw(auVar16,auVar13);
    sVar15 = auVar16._0_2_;
    sVar17 = auVar16._2_2_;
    sVar18 = auVar16._4_2_;
    sVar19 = auVar16._6_2_;
    sVar20 = auVar16._8_2_;
    sVar21 = auVar16._10_2_;
    sVar22 = auVar16._12_2_;
    sVar23 = auVar16._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar16[0xe] - (0xff < sVar23),
                  CONCAT16((0 < sVar22) * (sVar22 < 0x100) * auVar16[0xc] - (0xff < sVar22),
                           CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar16[10] - (0xff < sVar21),
                                    CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar16[8] -
                                             (0xff < sVar20),
                                             CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar16[6] -
                                                      (0xff < sVar19),
                                                      CONCAT12((0 < sVar18) * (sVar18 < 0x100) *
                                                               auVar16[4] - (0xff < sVar18),
                                                               CONCAT11((0 < sVar17) *
                                                                        (sVar17 < 0x100) *
                                                                        auVar16[2] - (0xff < sVar17)
                                                                        ,(0 < sVar15) *
                                                                         (sVar15 < 0x100) *
                                                                         auVar16[0] -
                                                                         (0xff < sVar15))))))));
    dst = dst + dst_stride;
    src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_sy_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  (void)w;

  do {
    const __m128i v_ra_b = xx_loadu_128(mask);
    const __m128i v_rb_b = xx_loadu_128(mask + mask_stride);

    const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
    const __m128i v_r_s_b = _mm_shuffle_epi8(v_rvs_b, v_shuffle_b);
    const __m128i v_r0_s_w = _mm_cvtepu8_epi16(v_r_s_b);
    const __m128i v_r1_s_w = _mm_cvtepu8_epi16(_mm_srli_si128(v_r_s_b, 8));
    const __m128i v_rs_w = _mm_add_epi16(v_r0_s_w, v_r1_s_w);
    const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
    const __m128i v_m0_b = _mm_packus_epi16(v_m0_w, v_m0_w);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}